

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_many_bindings
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  key_type *pkVar1;
  size_type *psVar2;
  pointer pbVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _func_int **pp_Var6;
  eStageType eVar7;
  ShaderProgram *pSVar8;
  long lVar9;
  pointer pcVar10;
  bool bVar11;
  LayoutBindingTestResult *pLVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  undefined4 extraout_var;
  ostream *poVar16;
  LayoutBindingProgram *pLVar17;
  mapped_type_conflict *pmVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar19;
  undefined8 *puVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  pointer pbVar24;
  uint uVar25;
  ulong uVar26;
  StringIntMap offsets;
  int max_bindings;
  StringVector list;
  StringVector list_1;
  IntVector expected;
  StringStream s;
  undefined1 local_330 [48];
  String local_300;
  LayoutBindingTestResult *local_2e0;
  int local_2d4;
  LayoutBindingProgram *local_2d0;
  undefined1 local_2c8 [24];
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  IProgramContextSupplier *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  String local_278;
  vector<int,_std::allocator<int>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  pointer *local_218;
  long local_210;
  pointer local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  undefined1 local_1d8 [112];
  undefined **local_168 [27];
  undefined8 local_90;
  undefined2 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined4 extraout_var_00;
  
  local_2d4 = 0;
  eVar7 = (this->super_LayoutBindingBaseCase).m_stage.type;
  iVar15 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  uVar21 = 0x8264;
  if (eVar7 == FragmentShader) {
    uVar21 = 0x92d0;
  }
  uVar22 = 0x92cc;
  if (eVar7 != VertexShader) {
    uVar22 = uVar21;
  }
  (**(code **)(CONCAT44(extraout_var,iVar15) + 0x868))(uVar22,&local_2d4);
  std::ios_base::ios_base((ios_base *)local_168);
  local_168[0] = (undefined **)glUniformMatrix3x2fv;
  local_90 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  local_1d8._0_8_ = &PTR__StringStream_020f2a68;
  local_168[0] = &PTR__StringStream_020f2a90;
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_300,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_330,this,&local_300);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
  pcVar4 = local_330 + 0x10;
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  paVar5 = &local_300.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5) {
    operator_delete((undefined1 *)
                    CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                    local_300.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_ACCESS",(String *)local_330);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  StringStream::reset((StringStream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=2, offset=4) uniform atomic_uint;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_330,this,0);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",(String *)local_330);
  if ((char *)local_330._0_8_ != pcVar4) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  local_2a0 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar15 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
             _vptr_IProgramContextSupplier[6])();
  pLVar17 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar15);
  iVar15 = (*pLVar17->_vptr_LayoutBindingProgram[2])(pLVar17);
  pSVar8 = pLVar17->m_program;
  if (iVar15 == 2) {
    if (((*pSVar8->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true) goto LAB_00bd61b6;
LAB_00bd5b59:
    if ((pSVar8->m_program).m_info.linkOk == false) goto LAB_00bd61b6;
    local_2c8._0_8_ = (key_type *)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    (*pLVar17->_vptr_LayoutBindingProgram[5])(local_330,pLVar17,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_330,(key_type *)local_2c8._0_8_);
    if (*pmVar18 == 4) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_330);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
      (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base((ios_base *)local_168);
      if (local_2d4 < 2) {
LAB_00bd65be:
        std::ios_base::ios_base((ios_base *)local_168);
        local_168[0] = (undefined **)glUniformMatrix3x2fv;
        local_90 = 0;
        local_88 = 0;
        local_80 = 0;
        uStack_78 = 0;
        local_70 = 0;
        uStack_68 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        local_1d8._0_8_ = &PTR__StringStream_020f2a68;
        local_168[0] = &PTR__StringStream_020f2a90;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_300,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(local_330,this,&local_300);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
            &local_300.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ),local_300.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                   (String *)local_330);
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        StringStream::reset((StringStream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(binding=2, offset=4) uniform atomic_uint;\n",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(offset=8) uniform atomic_uint ",0x25);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,0);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                   (String *)local_330);
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        LayoutBindingBaseCase::updateTemplate
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type);
        iVar15 = (*local_2a0->_vptr_IProgramContextSupplier[6])();
        plVar19 = (long *)CONCAT44(extraout_var_02,iVar15);
        iVar15 = (**(code **)(*plVar19 + 0x10))(plVar19);
        lVar9 = plVar19[6];
        if (iVar15 == 2) {
          if (*(char *)(**(long **)(lVar9 + 0x78) + 0x58) != '\x01') goto LAB_00bd68a2;
LAB_00bd6855:
          if (*(char *)(lVar9 + 0xc0) != '\x01') goto LAB_00bd68a2;
          local_330._0_8_ = pcVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_330,"should not compile","");
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
        }
        else {
          if (*(char *)(**(long **)(lVar9 + 0x18) + 0x58) != '\0') goto LAB_00bd6855;
LAB_00bd68a2:
          (**(code **)(*plVar19 + 8))(plVar19);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
          std::ios_base::ios_base((ios_base *)local_168);
          local_168[0] = (undefined **)glUniformMatrix3x2fv;
          local_90 = 0;
          local_88 = 0;
          local_80 = 0;
          uStack_78 = 0;
          local_70 = 0;
          uStack_68 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          local_1d8._0_8_ = &PTR__StringStream_020f2a68;
          local_168[0] = &PTR__StringStream_020f2a90;
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(&local_300,this,0);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x1b])(local_330,this,&local_300);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
          if ((char *)local_330._0_8_ != pcVar4) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
              &local_300.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                     local_300._M_dataplus._M_p._0_4_),
                            local_300.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                     (String *)local_330);
          if ((char *)local_330._0_8_ != pcVar4) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          StringStream::reset((StringStream *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"layout(offset=4) uniform atomic_uint ",0x25);
          (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x17])(local_330,this,0);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
          if ((char *)local_330._0_8_ != pcVar4) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          std::__cxx11::stringbuf::str();
          LayoutBindingBaseCase::setTemplateParam
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                     (String *)local_330);
          if ((char *)local_330._0_8_ != pcVar4) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          LayoutBindingBaseCase::updateTemplate
                    (&this->super_LayoutBindingBaseCase,
                     (this->super_LayoutBindingBaseCase).m_stage.type);
          iVar15 = (*local_2a0->_vptr_IProgramContextSupplier[6])();
          plVar19 = (long *)CONCAT44(extraout_var_03,iVar15);
          iVar15 = (**(code **)(*plVar19 + 0x10))(plVar19);
          lVar9 = plVar19[6];
          local_2e0 = __return_storage_ptr__;
          if (iVar15 == 2) {
            if (*(char *)(**(long **)(lVar9 + 0x78) + 0x58) != '\x01') goto LAB_00bd6ba4;
          }
          else if (*(char *)(**(long **)(lVar9 + 0x18) + 0x58) == '\0') goto LAB_00bd6ba4;
          if (*(char *)(lVar9 + 0xc0) != '\x01') {
LAB_00bd6ba4:
            (**(code **)(*plVar19 + 8))(plVar19);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            if (1 < local_2d4) {
              bVar13 = true;
              do {
                bVar11 = bVar13;
                std::ios_base::ios_base((ios_base *)local_168);
                local_168[0] = (undefined **)glUniformMatrix3x2fv;
                local_90 = 0;
                local_88 = 0;
                local_70 = 0;
                uStack_68 = 0;
                local_80 = 0;
                uStack_78 = 0;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
                local_1d8._0_8_ = &PTR__StringStream_020f2a68;
                local_168[0] = &PTR__StringStream_020f2a90;
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])(&local_300,this,0);
                pcVar4 = local_330 + 0x10;
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                    != &local_300.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                           local_300._M_dataplus._M_p._0_4_),
                                  local_300.field_2._M_allocated_capacity + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])(&local_300,this,1);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                    != &local_300.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                           local_300._M_dataplus._M_p._0_4_),
                                  local_300.field_2._M_allocated_capacity + 1);
                }
                if (!bVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_300,this,2);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((char *)local_330._0_8_ != pcVar4) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                      != &local_300.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                             local_300._M_dataplus._M_p._0_4_),
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                }
                std::__cxx11::stringbuf::str();
                LayoutBindingBaseCase::setTemplateParam
                          (&this->super_LayoutBindingBaseCase,
                           (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                           (String *)local_330);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                StringStream::reset((StringStream *)local_1d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint ",
                           0x30);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])((String *)local_330,this,0);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"layout(binding=2, offset=0) uniform atomic_uint ",
                           0x30);
                (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0x17])((String *)local_330,this,1);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                if (!bVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint "
                             ,0x30);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)local_330,this,2);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((char *)local_330._0_8_ != pcVar4) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                }
                std::__cxx11::stringbuf::str();
                LayoutBindingBaseCase::setTemplateParam
                          (&this->super_LayoutBindingBaseCase,
                           (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                           (String *)local_330);
                if ((char *)local_330._0_8_ != pcVar4) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                LayoutBindingBaseCase::updateTemplate
                          (&this->super_LayoutBindingBaseCase,
                           (this->super_LayoutBindingBaseCase).m_stage.type);
                iVar15 = (*local_2a0->_vptr_IProgramContextSupplier[6])();
                pLVar17 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar15);
                iVar15 = (*pLVar17->_vptr_LayoutBindingProgram[2])(pLVar17);
                pSVar8 = pLVar17->m_program;
                if (iVar15 == 2) {
                  if (((*pSVar8->m_shaders[5].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_info).compileOk != true)
                  goto LAB_00bd7007;
LAB_00bd7018:
                  cVar14 = (pSVar8->m_program).m_info.linkOk;
                }
                else {
                  if (((*pSVar8->m_shaders[1].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->m_info).compileOk != false)
                  goto LAB_00bd7018;
LAB_00bd7007:
                  cVar14 = '\0';
                }
                if (bVar11) {
                  if (cVar14 == '\0') {
                    local_330._0_8_ = pcVar4;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_330,"should not compile","");
                    local_2e0->m_passed = false;
                    local_2e0->m_notRunForThisContext = false;
                    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2
                    ;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2e0->m_reason,local_330._0_8_,
                               (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00bd7628:
                    if ((char *)local_330._0_8_ != pcVar4) {
                      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                    }
                    (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                    std::ios_base::~ios_base((ios_base *)local_168);
                    return local_2e0;
                  }
                }
                else if (cVar14 != '\0') {
                  LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar17,false);
                  local_2e0->m_passed = true;
                  local_2e0->m_notRunForThisContext = false;
                  (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2e0->m_reason,local_330._0_8_,
                             (char *)(local_330._0_8_ + local_330._8_8_));
                  goto LAB_00bd7628;
                }
                (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                std::ios_base::~ios_base((ios_base *)local_168);
                bVar13 = false;
              } while (bVar11);
              if (1 < local_2d4) {
                bVar13 = true;
                do {
                  bVar11 = bVar13;
                  std::ios_base::ios_base((ios_base *)local_168);
                  local_168[0] = (undefined **)glUniformMatrix3x2fv;
                  local_90 = 0;
                  local_88 = 0;
                  local_70 = 0;
                  uStack_68 = 0;
                  local_80 = 0;
                  uStack_78 = 0;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
                  local_1d8._0_8_ = &PTR__StringStream_020f2a68;
                  local_168[0] = &PTR__StringStream_020f2a90;
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_300,this,0);
                  paVar5 = &local_300.field_2;
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                      != paVar5) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                             local_300._M_dataplus._M_p._0_4_),
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])(&local_300,this,1);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                      != paVar5) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                             local_300._M_dataplus._M_p._0_4_),
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar11) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x17])(&local_300,this,2);
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1d8,(char *)local_330._0_8_,
                                         local_330._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                    local_300._M_dataplus._M_p._0_4_) != paVar5) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                               local_300._M_dataplus._M_p._0_4_),
                                      local_300.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::__cxx11::stringbuf::str();
                  LayoutBindingBaseCase::setTemplateParam
                            (&this->super_LayoutBindingBaseCase,
                             (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                             (String *)local_330);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  StringStream::reset((StringStream *)local_1d8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint "
                             ,0x30);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)local_330,this,0);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,"layout(binding=2, offset=0) uniform atomic_uint "
                             ,0x30);
                  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode
                    ._vptr_TestNode[0x17])((String *)local_330,this,1);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  if (!bVar11) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d8,
                               "layout(binding=1, offset=2) uniform atomic_uint ",0x30);
                    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0x17])((String *)local_330,this,2);
                    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1d8,(char *)local_330._0_8_,
                                         local_330._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
                    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                    }
                  }
                  std::__cxx11::stringbuf::str();
                  LayoutBindingBaseCase::setTemplateParam
                            (&this->super_LayoutBindingBaseCase,
                             (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                             (String *)local_330);
                  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                  }
                  LayoutBindingBaseCase::updateTemplate
                            (&this->super_LayoutBindingBaseCase,
                             (this->super_LayoutBindingBaseCase).m_stage.type);
                  iVar15 = (*local_2a0->_vptr_IProgramContextSupplier[6])();
                  pLVar17 = (LayoutBindingProgram *)CONCAT44(extraout_var_05,iVar15);
                  iVar15 = (*pLVar17->_vptr_LayoutBindingProgram[2])(pLVar17);
                  pSVar8 = pLVar17->m_program;
                  if (iVar15 == 2) {
                    if (((*pSVar8->m_shaders[5].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start)->m_info).compileOk != true)
                    goto LAB_00bd74e2;
LAB_00bd74f3:
                    cVar14 = (pSVar8->m_program).m_info.linkOk;
                  }
                  else {
                    if (((*pSVar8->m_shaders[1].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start)->m_info).compileOk != false)
                    goto LAB_00bd74f3;
LAB_00bd74e2:
                    cVar14 = '\0';
                  }
                  if (bVar11) {
                    if (cVar14 == '\0') {
                      local_330._0_8_ = local_330 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_330,"should not compile","");
                      __return_storage_ptr__ = local_2e0;
                      local_2e0->m_passed = false;
                      local_2e0->m_notRunForThisContext = false;
                      (local_2e0->m_reason)._M_dataplus._M_p =
                           (pointer)&(local_2e0->m_reason).field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2e0->m_reason,local_330._0_8_,
                                 (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00bd77b9:
                      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                      }
                      (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                      goto LAB_00bd62e8;
                    }
                  }
                  else if (cVar14 != '\0') {
                    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar17,false);
                    __return_storage_ptr__ = local_2e0;
                    local_2e0->m_passed = true;
                    local_2e0->m_notRunForThisContext = false;
                    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2
                    ;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2e0->m_reason,local_330._0_8_,
                               (char *)(local_330._0_8_ + local_330._8_8_));
                    goto LAB_00bd77b9;
                  }
                  (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                  std::ios_base::~ios_base((ios_base *)local_168);
                  bVar13 = false;
                } while (bVar11);
              }
            }
            pLVar12 = local_2e0;
            pp_Var6 = (_func_int **)(local_1d8 + 0x10);
            local_1d8._8_8_ = 0;
            local_1d8[0x10] = 0;
            local_2e0->m_passed = true;
            local_2e0->m_notRunForThisContext = false;
            (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
            local_1d8._0_8_ = pp_Var6;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2e0->m_reason,pp_Var6,pp_Var6);
            if ((_func_int **)local_1d8._0_8_ == pp_Var6) {
              return pLVar12;
            }
            operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
            return pLVar12;
          }
          local_330._0_8_ = pcVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_330,"should not compile","");
          __return_storage_ptr__ = local_2e0;
          local_2e0->m_passed = false;
          local_2e0->m_notRunForThisContext = false;
          (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
        }
        if ((char *)local_330._0_8_ != pcVar4) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (**(code **)(*plVar19 + 8))(plVar19);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        goto LAB_00bd62e8;
      }
      std::ios_base::ios_base((ios_base *)local_168);
      local_168[0] = (undefined **)glUniformMatrix3x2fv;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 0;
      uStack_68 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      local_1d8._0_8_ = &PTR__StringStream_020f2a68;
      local_168[0] = &PTR__StringStream_020f2a90;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,2);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,3);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      StringStream::reset((StringStream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=3, offset=4) uniform atomic_uint ",0x30);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,0);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,1);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=3) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,2);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,3);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,";\n",2);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",(String *)local_330);
      if ((char *)local_330._0_8_ != pcVar4) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      iVar15 = (*local_2a0->_vptr_IProgramContextSupplier[6])();
      pLVar17 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar15);
      iVar15 = (*pLVar17->_vptr_LayoutBindingProgram[2])(pLVar17);
      pSVar8 = pLVar17->m_program;
      if (iVar15 == 2) {
        if (((*pSVar8->m_shaders[5].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk == true) {
LAB_00bd6313:
          if ((pSVar8->m_program).m_info.linkOk != false) {
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2d0 = pLVar17;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
            if ((char *)local_330._0_8_ != pcVar4) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
            if ((char *)local_330._0_8_ != pcVar4) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
            if ((char *)local_330._0_8_ != pcVar4) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330);
            if ((char *)local_330._0_8_ != pcVar4) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_60,&local_298);
            (*pLVar17->_vptr_LayoutBindingProgram[5])(local_330,pLVar17,&local_60);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_60);
            local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_300._M_dataplus._M_p._0_4_ = 4;
            std::vector<int,_std::allocator<int>_>::_M_insert_rval
                      (&local_258,(const_iterator)0x0,(value_type_conflict1 *)&local_300);
            local_300._M_dataplus._M_p._0_4_ = 0;
            std::vector<int,_std::allocator<int>_>::_M_insert_rval
                      (&local_258,
                       (const_iterator)
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
            local_300._M_dataplus._M_p._0_4_ = 8;
            std::vector<int,_std::allocator<int>_>::_M_insert_rval
                      (&local_258,
                       (const_iterator)
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
            local_300._M_dataplus._M_p._0_4_ = 4;
            local_2e0 = __return_storage_ptr__;
            std::vector<int,_std::allocator<int>_>::_M_insert_rval
                      (&local_258,
                       (const_iterator)
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
            if (local_298.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_298.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar25 = 1;
              uVar26 = 0;
              do {
                iVar15 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar26];
                pmVar18 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                        *)local_330,
                                       local_298.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar26);
                if (iVar15 != *pmVar18) {
                  local_238 = local_228;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_238,"offset of","");
                  pcVar10 = local_298.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar26]._M_dataplus._M_p;
                  local_1f8 = local_1e8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1f8,pcVar10,
                             pcVar10 + local_298.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar26].
                                       _M_string_length);
                  uVar23 = 0xf;
                  if (local_238 != local_228) {
                    uVar23 = local_228[0];
                  }
                  if (uVar23 < (ulong)(local_1f0 + local_230)) {
                    uVar23 = 0xf;
                    if (local_1f8 != local_1e8) {
                      uVar23 = local_1e8[0];
                    }
                    if (uVar23 < (ulong)(local_1f0 + local_230)) goto LAB_00bd7724;
                    plVar19 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238);
                  }
                  else {
LAB_00bd7724:
                    plVar19 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_238,(ulong)local_1f8);
                  }
                  local_2c8._0_8_ = local_2c8 + 0x10;
                  pkVar1 = (key_type *)(plVar19 + 2);
                  if ((key_type *)*plVar19 == pkVar1) {
                    local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
                    uStack_2b0 = (undefined4)plVar19[3];
                    uStack_2ac = *(undefined4 *)((long)plVar19 + 0x1c);
                  }
                  else {
                    local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
                    local_2c8._0_8_ = (key_type *)*plVar19;
                  }
                  local_2c8._8_8_ = plVar19[1];
                  *plVar19 = (long)pkVar1;
                  plVar19[1] = 0;
                  *(undefined1 *)&(pkVar1->_M_dataplus)._M_p = 0;
                  local_218 = local_208;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_218,"did not match requested","");
                  pbVar3 = (pointer)((long)&((_Alloc_hider *)local_2c8._8_8_)->_M_p + local_210);
                  pbVar24 = (pointer)0xf;
                  if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
                    pbVar24 = (pointer)local_2c8._16_8_;
                  }
                  if (pbVar24 < pbVar3) {
                    pbVar24 = (pointer)0xf;
                    if (local_218 != local_208) {
                      pbVar24 = local_208[0];
                    }
                    if (pbVar24 < pbVar3) goto LAB_00bd78d7;
                    puVar20 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_218,0,(char *)0x0,local_2c8._0_8_);
                  }
                  else {
LAB_00bd78d7:
                    puVar20 = (undefined8 *)
                              std::__cxx11::string::_M_append(local_2c8,(ulong)local_218);
                  }
                  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                  psVar2 = puVar20 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar20 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar2) {
                    local_278.field_2._M_allocated_capacity = *psVar2;
                    local_278.field_2._8_8_ = puVar20[3];
                  }
                  else {
                    local_278.field_2._M_allocated_capacity = *psVar2;
                    local_278._M_dataplus._M_p = (pointer)*puVar20;
                  }
                  local_278._M_string_length = puVar20[1];
                  *puVar20 = psVar2;
                  puVar20[1] = 0;
                  *(undefined1 *)psVar2 = 0;
                  pmVar18 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)local_330,
                                         local_298.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar26);
                  LayoutBindingBaseCase::generateLog<int,int>
                            (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar18,4);
                  pLVar17 = local_2d0;
                  local_2e0->m_passed = false;
                  local_2e0->m_notRunForThisContext = false;
                  (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2e0->m_reason,
                             CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                      local_300._M_dataplus._M_p._0_4_),
                             local_300._M_string_length +
                             CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                      local_300._M_dataplus._M_p._0_4_));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                      != &local_300.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                             local_300._M_dataplus._M_p._0_4_),
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    local_278.field_2._M_allocated_capacity + 1);
                  }
                  if (local_218 != local_208) {
                    operator_delete(local_218,(ulong)((long)&(local_208[0]->_M_dataplus)._M_p + 1));
                  }
                  __return_storage_ptr__ = local_2e0;
                  if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
                    operator_delete((void *)local_2c8._0_8_,
                                    (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
                  }
                  if (local_1f8 != local_1e8) {
                    operator_delete(local_1f8,local_1e8[0] + 1);
                  }
                  if (local_238 != local_228) {
                    operator_delete(local_238,local_228[0] + 1);
                  }
                  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_330);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_298);
                  (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                  goto LAB_00bd62e8;
                }
                uVar26 = (ulong)uVar25;
                uVar25 = uVar25 + 1;
              } while (uVar26 < (ulong)((long)local_298.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_298.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_330);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_298);
            (*local_2d0->_vptr_LayoutBindingProgram[1])();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            __return_storage_ptr__ = local_2e0;
            goto LAB_00bd65be;
          }
        }
      }
      else if (((*pSVar8->m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd6313;
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar17,false);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,local_330._0_8_,
                 (char *)(local_330._0_8_ + local_330._8_8_));
      goto LAB_00bd61e9;
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"offset did not match requested","");
    pmVar18 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_330,(key_type *)local_2c8._0_8_);
    LayoutBindingBaseCase::generateLog<int,int>
              (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar18,1);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,
               CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
               local_300._M_string_length +
               CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar5) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
  }
  else {
    if (((*pSVar8->m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bd5b59;
LAB_00bd61b6:
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar17,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_330._0_8_,
               (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00bd61e9:
    if ((char *)local_330._0_8_ != pcVar4) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
  }
  (*pLVar17->_vptr_LayoutBindingProgram[1])(pLVar17);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
LAB_00bd62e8:
  std::ios_base::~ios_base((ios_base *)local_168);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_examples_many_bindings(void)
	{
		int max_bindings = 0;

		if (isStage(VertexShader))
		{
			gl().getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else if (isStage(FragmentShader))
		{
			gl().getIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else
		{
			gl().getIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}

		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		if (max_bindings >= 2)
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=3, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=3) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 0);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 4);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], 4));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=2) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		return true;
	}